

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DateFormatSymbols::setQuarters
          (DateFormatSymbols *this,UnicodeString *quartersArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  UMemory *this_00;
  long lVar3;
  long lVar4;
  UnicodeString **local_38;
  
  pUVar2 = quartersArray;
  if (context == STANDALONE) {
    if (width == ABBREVIATED) {
      local_38 = &this->fStandaloneShortQuarters;
      pUVar1 = this->fStandaloneShortQuarters;
      if (pUVar1 == (UnicodeString *)0x0) {
        lVar4 = 0x1b0;
        goto LAB_002d0a10;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar4 = 0x1b0;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      local_38 = &this->fStandaloneQuarters;
      pUVar1 = this->fStandaloneQuarters;
      if (pUVar1 == (UnicodeString *)0x0) {
        lVar4 = 0x1a0;
        goto LAB_002d0a10;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar4 = 0x1a0;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
  }
  else {
    if (context != FORMAT) {
      return;
    }
    if (width == ABBREVIATED) {
      local_38 = &this->fShortQuarters;
      pUVar1 = this->fShortQuarters;
      if (pUVar1 == (UnicodeString *)0x0) {
        lVar4 = 400;
        goto LAB_002d0a10;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar4 = 400;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      local_38 = &this->fQuarters;
      pUVar1 = this->fQuarters;
      if (pUVar1 == (UnicodeString *)0x0) {
        lVar4 = 0x180;
        goto LAB_002d0a10;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar4 = 0x180;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
  }
  UMemory::operator_delete__(this_00,pUVar2);
LAB_002d0a10:
  pUVar2 = newUnicodeStringArray((long)count);
  *local_38 = pUVar2;
  uprv_arrayCopy(quartersArray,pUVar2,count);
  *(int32_t *)((long)&(this->super_UObject)._vptr_UObject + lVar4) = count;
  return;
}

Assistant:

void
DateFormatSymbols::setQuarters(const UnicodeString* quartersArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fQuarters)
                delete[] fQuarters;
            fQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fQuarters,count);
            fQuartersCount = count;
            break;
        case ABBREVIATED :
            if (fShortQuarters)
                delete[] fShortQuarters;
            fShortQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fShortQuarters,count);
            fShortQuartersCount = count;
            break;
        case NARROW :
        /*
            if (fNarrowQuarters)
                delete[] fNarrowQuarters;
            fNarrowQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fNarrowQuarters,count);
            fNarrowQuartersCount = count;
        */
            break;
        default :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneQuarters)
                delete[] fStandaloneQuarters;
            fStandaloneQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneQuarters,count);
            fStandaloneQuartersCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortQuarters)
                delete[] fStandaloneShortQuarters;
            fStandaloneShortQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneShortQuarters,count);
            fStandaloneShortQuartersCount = count;
            break;
        case NARROW :
        /*
           if (fStandaloneNarrowQuarters)
                delete[] fStandaloneNarrowQuarters;
            fStandaloneNarrowQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneNarrowQuarters,count);
            fStandaloneNarrowQuartersCount = count;
        */
            break;
        default :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}